

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int lua_yieldk(lua_State *L,int nresults,lua_KContext ctx,lua_KFunction k)

{
  CallInfo *pCVar1;
  char *fmt;
  
  if (L->nny != 0) {
    if (L->l_G->mainthread == L) {
      fmt = "attempt to yield from outside a coroutine";
    }
    else {
      fmt = "attempt to yield across a C-call boundary";
    }
    luaG_runerror(L,fmt);
  }
  pCVar1 = L->ci;
  L->status = '\x01';
  pCVar1->extra = (long)pCVar1->func - (long)L->stack;
  if ((pCVar1->callstatus & 2) != 0) {
    return 0;
  }
  (pCVar1->u).c.k = k;
  if (k != (lua_KFunction)0x0) {
    (pCVar1->u).c.ctx = ctx;
  }
  pCVar1->func = L->top + (-1 - (long)nresults);
  luaD_throw(L,1);
}

Assistant:

LUA_API int lua_yieldk (lua_State *L, int nresults, lua_KContext ctx,
                        lua_KFunction k) {
  CallInfo *ci = L->ci;
  luai_userstateyield(L, nresults);
  lua_lock(L);
  api_checknelems(L, nresults);
  if (L->nny > 0) {
    if (L != G(L)->mainthread)
      luaG_runerror(L, "attempt to yield across a C-call boundary");
    else
      luaG_runerror(L, "attempt to yield from outside a coroutine");
  }
  L->status = LUA_YIELD;
  ci->extra = savestack(L, ci->func);  /* save current 'func' */
  if (isLua(ci)) {  /* inside a hook? */
    api_check(L, k == NULL, "hooks cannot continue after yielding");
  }
  else {
    if ((ci->u.c.k = k) != NULL)  /* is there a continuation? */
      ci->u.c.ctx = ctx;  /* save context */
    ci->func = L->top - nresults - 1;  /* protect stack below results */
    luaD_throw(L, LUA_YIELD);
  }
  lua_assert(ci->callstatus & CIST_HOOKED);  /* must be inside a hook */
  lua_unlock(L);
  return 0;  /* return to 'luaD_hook' */
}